

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int var_mult_const(gen_ctx_t gen_ctx,ssa_edge_t_conflict se,bb_t_conflict from_bb,
                  MIR_op_t **var_op_ref,int64_t *c)

{
  MIR_insn_t pMVar1;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  MIR_insn_t local_50;
  MIR_op_t *res_ref;
  MIR_insn_t insn;
  MIR_reg_t reg;
  int64_t *c_local;
  MIR_op_t **var_op_ref_local;
  bb_t_conflict from_bb_local;
  ssa_edge_t_conflict se_local;
  gen_ctx_t gen_ctx_local;
  
  if (se == (ssa_edge_t_conflict)0x0) {
    gen_ctx_local._4_4_ = 0;
  }
  else {
    if ((*var_op_ref == (MIR_op_t *)0x0) || ((*(ushort *)&(*var_op_ref)->field_0x8 & 0xff) != 2)) {
      __assert_fail("*var_op_ref != ((void*)0) && (*var_op_ref)->mode == MIR_OP_VAR",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x15e4,
                    "int var_mult_const(gen_ctx_t, ssa_edge_t, bb_t, MIR_op_t **, int64_t *)");
    }
    pcVar4 = MIR_reg_hard_reg_name
                       (gen_ctx->ctx,((*var_op_ref)->u).reg - 0x21,(gen_ctx->curr_func_item->u).func
                       );
    if (pcVar4 == (char *)0x0) {
      pMVar1 = se->def->insn;
      local_50 = (MIR_insn_t)0x0;
      *c = 0;
      if (((((int)*(undefined8 *)&pMVar1->field_0x18 == 0x2c) ||
           ((int)*(undefined8 *)&pMVar1->field_0x18 == 0x42)) &&
          (((ulong)pMVar1[1].insn_link.prev & 0xff) == 2)) &&
         (iVar3 = get_int_const(gen_ctx,(MIR_op_t *)&pMVar1[1].ops[0].u.str,c), iVar3 != 0)) {
        local_50 = pMVar1 + 1;
        if ((int)*(undefined8 *)&pMVar1->field_0x18 == 0x42) {
          if ((*c < 0) || (0x3f < *c)) {
            local_50 = (MIR_insn_t)0x0;
          }
          else {
            *c = 1L << ((byte)*c & 0x3f);
          }
        }
      }
      else if ((((int)*(undefined8 *)&pMVar1->field_0x18 == 0x2c) &&
               ((undefined1  [32])((undefined1  [32])pMVar1[1].ops[0].u & (undefined1  [32])0xff) ==
                (undefined1  [32])0x2)) &&
              (iVar3 = get_int_const(gen_ctx,(MIR_op_t *)(pMVar1 + 1),c), iVar3 != 0)) {
        local_50 = (MIR_insn_t)&pMVar1[1].ops[0].u;
      }
      if (local_50 == (MIR_insn_t)0x0) {
        gen_ctx_local._4_4_ = 0;
      }
      else if ((*c < 0) || (0xff < *c)) {
        gen_ctx_local._4_4_ = 0;
      }
      else {
        pvVar2 = local_50->data;
        if (((pvVar2 == (void *)0x0) ||
            (*(bb_t_conflict *)(*(long *)((long)pvVar2 + 8) + 0x30) == from_bb)) ||
           (iVar3 = cycle_phi_p(*(bb_insn_t_conflict *)((long)pvVar2 + 8)), iVar3 == 0)) {
          *var_op_ref = (MIR_op_t *)local_50;
          gen_ctx_local._4_4_ = 1;
        }
        else {
          gen_ctx_local._4_4_ = 0;
        }
      }
    }
    else {
      gen_ctx_local._4_4_ = 0;
    }
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int var_mult_const (gen_ctx_t gen_ctx, ssa_edge_t se, bb_t from_bb, MIR_op_t **var_op_ref,
                           int64_t *c) {
  if (se == NULL) return FALSE; /* e.g. for arg */
  gen_assert (*var_op_ref != NULL && (*var_op_ref)->mode == MIR_OP_VAR);
  MIR_reg_t reg = (*var_op_ref)->u.var - MAX_HARD_REG;
  if (MIR_reg_hard_reg_name (gen_ctx->ctx, reg, curr_func_item->u.func) != NULL) return FALSE;
  MIR_insn_t insn = se->def->insn;
  MIR_op_t *res_ref = NULL;
  *c = 0;
  if ((insn->code == MIR_MUL || insn->code == MIR_LSH) && insn->ops[1].mode == MIR_OP_VAR
      && get_int_const (gen_ctx, &insn->ops[2], c)) {
    res_ref = &insn->ops[1];
    if (insn->code == MIR_LSH) {
      if (*c < 0 || *c >= (int) sizeof (int64_t) * 8)
        res_ref = NULL;
      else
        *c = (int64_t) 1 << *c;
    }
  } else if (insn->code == MIR_MUL && insn->ops[2].mode == MIR_OP_VAR
             && get_int_const (gen_ctx, &insn->ops[1], c)) {
    res_ref = &insn->ops[2];
  }
  if (res_ref == NULL) return FALSE;
  if (*c < 0 || *c > MIR_MAX_SCALE) return FALSE;
  if ((se = res_ref->data) != NULL && se->def->bb != from_bb && cycle_phi_p (se->def)) return FALSE;
  *var_op_ref = res_ref;
  return TRUE;
}